

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenMutate
          (string *__return_storage_ptr__,SwiftGenerator *this,string *offset,string *get_offset,
          bool isRaw)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  byte local_29;
  string *psStack_28;
  bool isRaw_local;
  string *get_offset_local;
  string *offset_local;
  SwiftGenerator *this_local;
  
  local_29 = isRaw;
  psStack_28 = get_offset;
  get_offset_local = offset;
  offset_local = (string *)this;
  this_local = (SwiftGenerator *)__return_storage_ptr__;
  std::operator+(&local_d0,
                 "@discardableResult {{ACCESS_TYPE}} func mutate({{FIELDVAR}}: {{VALUETYPE}}) -> Bool {"
                 ,get_offset);
  std::operator+(&local_b0,&local_d0," return {{ACCESS}}.mutate({{FIELDVAR}}");
  __rhs = "";
  if ((local_29 & 1) != 0) {
    __rhs = ".rawValue";
  }
  std::operator+(&local_90,&local_b0,__rhs);
  std::operator+(&local_70,&local_90,", index: ");
  std::operator+(&local_50,&local_70,get_offset_local);
  std::operator+(__return_storage_ptr__,&local_50,") }");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenMutate(const std::string &offset,
                        const std::string &get_offset, bool isRaw = false) {
    return "@discardableResult {{ACCESS_TYPE}} func mutate({{FIELDVAR}}: "
           "{{VALUETYPE}}) -> Bool {" +
           get_offset + " return {{ACCESS}}.mutate({{FIELDVAR}}" +
           (isRaw ? ".rawValue" : "") + ", index: " + offset + ") }";
  }